

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O3

int __thiscall
Imf_3_2::DwaCompressor::compress
          (DwaCompressor *this,char *inPtr,int inSize,Box2i *range,char **outPtr)

{
  ulong *puVar1;
  vector<char_const*,std::allocator<char_const*>> *this_00;
  char cVar2;
  uint minY;
  uint maxY;
  uint uVar3;
  CompressorScheme CVar4;
  iterator __position;
  byte bVar5;
  void *pvVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  size_type *psVar10;
  char *pcVar11;
  pointer pCVar12;
  pointer pCVar13;
  pointer pCVar14;
  pointer ppcVar15;
  undefined8 uVar16;
  char *pcVar17;
  BaseExc *pBVar18;
  InputExc *this_01;
  long lVar19;
  char *pcVar20;
  uchar auVar21 [2];
  char *extraout_RDX;
  pointer pCVar22;
  uint uVar23;
  pointer pCVar24;
  undefined1 *toNonlinear;
  ulong uVar25;
  ulong uVar26;
  int byte;
  ulong uVar27;
  size_t __n;
  bool bVar28;
  ulong local_368;
  char *local_358;
  char *local_350;
  char *inDataPtr;
  char *local_330;
  char *local_328;
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  rowPtrs;
  vector<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
  channelRules;
  size_t outBufferSize;
  uchar b [2];
  undefined6 uStack_2e6;
  _Bit_pointer local_2c8;
  char *writePtr;
  int local_290;
  int local_28c;
  
  inDataPtr = inPtr;
  local_330 = inPtr;
  initializeDefaultChannelRules(this);
  outBufferSize = 0;
  initializeBuffers(this,&outBufferSize);
  channelRules.
  super__Vector_base<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  channelRules.
  super__Vector_base<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  channelRules.
  super__Vector_base<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  relevantChannelRules(this,&channelRules);
  if ((long)channelRules.
            super__Vector_base<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)channelRules.
            super__Vector_base<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
            ._M_impl.super__Vector_impl_data._M_start == 0) {
    auVar21[0] = '\x02';
    auVar21[1] = '\0';
  }
  else {
    lVar19 = ((long)channelRules.
                    super__Vector_base<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)channelRules.
                    super__Vector_base<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
    lVar19 = lVar19 + (ulong)(lVar19 == 0);
    psVar10 = &((channelRules.
                 super__Vector_base<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_suffix)._M_string_length;
    auVar21[0] = '\x02';
    auVar21[1] = '\0';
    do {
      auVar21 = (uchar  [2])((short)auVar21 + (short)*psVar10 + 3);
      psVar10 = psVar10 + 6;
      lVar19 = lVar19 + -1;
    } while (lVar19 != 0);
  }
  uVar27 = outBufferSize + (ushort)auVar21;
  outBufferSize = uVar27;
  if (this->_outBufferSize < uVar27) {
    this->_outBufferSize = uVar27;
    if (this->_outBuffer != (char *)0x0) {
      operator_delete__(this->_outBuffer);
    }
    pcVar11 = (char *)operator_new__(uVar27);
    this->_outBuffer = pcVar11;
  }
  else {
    pcVar11 = this->_outBuffer;
  }
  local_350 = this->_packedAcBuffer;
  local_358 = this->_packedDcBuffer;
  uVar23 = (range->max).x;
  if (this->_max[0] < (int)uVar23) {
    uVar23 = this->_max[0];
  }
  uVar27 = (ulong)uVar23;
  iVar9 = (range->min).x;
  minY = (range->min).y;
  maxY = (range->max).y;
  if (this->_max[1] < (int)maxY) {
    maxY = this->_max[1];
  }
  pcVar11[0x48] = '\0';
  pcVar11[0x49] = '\0';
  pcVar11[0x4a] = '\0';
  pcVar11[0x4b] = '\0';
  pcVar11[0x4c] = '\0';
  pcVar11[0x4d] = '\0';
  pcVar11[0x4e] = '\0';
  pcVar11[0x4f] = '\0';
  pcVar11[0x50] = '\0';
  pcVar11[0x51] = '\0';
  pcVar11[0x52] = '\0';
  pcVar11[0x53] = '\0';
  pcVar11[0x54] = '\0';
  pcVar11[0x55] = '\0';
  pcVar11[0x56] = '\0';
  pcVar11[0x57] = '\0';
  pcVar11[0x38] = '\0';
  pcVar11[0x39] = '\0';
  pcVar11[0x3a] = '\0';
  pcVar11[0x3b] = '\0';
  pcVar11[0x3c] = '\0';
  pcVar11[0x3d] = '\0';
  pcVar11[0x3e] = '\0';
  pcVar11[0x3f] = '\0';
  pcVar11[0x40] = '\0';
  pcVar11[0x41] = '\0';
  pcVar11[0x42] = '\0';
  pcVar11[0x43] = '\0';
  pcVar11[0x44] = '\0';
  pcVar11[0x45] = '\0';
  pcVar11[0x46] = '\0';
  pcVar11[0x47] = '\0';
  pcVar11[0x28] = '\0';
  pcVar11[0x29] = '\0';
  pcVar11[0x2a] = '\0';
  pcVar11[0x2b] = '\0';
  pcVar11[0x2c] = '\0';
  pcVar11[0x2d] = '\0';
  pcVar11[0x2e] = '\0';
  pcVar11[0x2f] = '\0';
  pcVar11[0x30] = '\0';
  pcVar11[0x31] = '\0';
  pcVar11[0x32] = '\0';
  pcVar11[0x33] = '\0';
  pcVar11[0x34] = '\0';
  pcVar11[0x35] = '\0';
  pcVar11[0x36] = '\0';
  pcVar11[0x37] = '\0';
  pcVar11[0x18] = '\0';
  pcVar11[0x19] = '\0';
  pcVar11[0x1a] = '\0';
  pcVar11[0x1b] = '\0';
  pcVar11[0x1c] = '\0';
  pcVar11[0x1d] = '\0';
  pcVar11[0x1e] = '\0';
  pcVar11[0x1f] = '\0';
  pcVar11[0x20] = '\0';
  pcVar11[0x21] = '\0';
  pcVar11[0x22] = '\0';
  pcVar11[0x23] = '\0';
  pcVar11[0x24] = '\0';
  pcVar11[0x25] = '\0';
  pcVar11[0x26] = '\0';
  pcVar11[0x27] = '\0';
  pcVar11[8] = '\0';
  pcVar11[9] = '\0';
  pcVar11[10] = '\0';
  pcVar11[0xb] = '\0';
  pcVar11[0xc] = '\0';
  pcVar11[0xd] = '\0';
  pcVar11[0xe] = '\0';
  pcVar11[0xf] = '\0';
  pcVar11[0x10] = '\0';
  pcVar11[0x11] = '\0';
  pcVar11[0x12] = '\0';
  pcVar11[0x13] = '\0';
  pcVar11[0x14] = '\0';
  pcVar11[0x15] = '\0';
  pcVar11[0x16] = '\0';
  pcVar11[0x17] = '\0';
  pcVar11[0] = '\x02';
  pcVar11[1] = '\0';
  pcVar11[2] = '\0';
  pcVar11[3] = '\0';
  pcVar11[4] = '\0';
  pcVar11[5] = '\0';
  pcVar11[6] = '\0';
  pcVar11[7] = '\0';
  *(ulong *)(pcVar11 + 0x50) = (ulong)this->_acCompression;
  setupChannelData(this,iVar9,minY,uVar23,maxY);
  local_328 = pcVar11 + (ulong)(ushort)auVar21 + 0x58;
  writePtr = this->_outBuffer + 0x58;
  b[0] = auVar21[0];
  b[1] = auVar21[1];
  lVar19 = 0;
  do {
    pcVar20 = writePtr;
    uVar27 = CONCAT71((int7)(uVar27 >> 8),b[lVar19]);
    writePtr = writePtr + 1;
    *pcVar20 = b[lVar19];
    lVar19 = lVar19 + 1;
  } while ((int)lVar19 != 2);
  if (channelRules.
      super__Vector_base<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      channelRules.
      super__Vector_base<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar19 = 0;
    uVar25 = 0;
    do {
      Classifier::write((Classifier *)
                        ((long)&((channelRules.
                                  super__Vector_base<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_suffix)._M_dataplus.
                                _M_p + lVar19),(int)&writePtr,pcVar20,uVar27);
      uVar25 = uVar25 + 1;
      lVar19 = lVar19 + 0x30;
      pcVar20 = extraout_RDX;
    } while (uVar25 < (ulong)(((long)channelRules.
                                     super__Vector_base<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)channelRules.
                                     super__Vector_base<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4) *
                             -0x5555555555555555));
  }
  writePtr = (char *)((ulong)writePtr & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)b,
             ((long)(this->_channelData).
                    super__Vector_base<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->_channelData).
                    super__Vector_base<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x79435e50d79435e5,
             (bool *)&writePtr,(allocator_type *)&rowPtrs);
  std::
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ::vector(&rowPtrs,((long)(this->_channelData).
                           super__Vector_base<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->_channelData).
                           super__Vector_base<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x79435e50d79435e5,
           (allocator_type *)&writePtr);
  pCVar22 = (this->_channelData).
            super__Vector_base<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pCVar12 = (this->_channelData).
            super__Vector_base<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((long)pCVar12 - (long)pCVar22 != 0) {
    uVar27 = ((long)pCVar12 - (long)pCVar22 >> 3) * -0x79435e50d79435e5;
    uVar23 = 0;
    do {
      bVar5 = (byte)uVar23 & 0x3f;
      puVar1 = (ulong *)(CONCAT62(uStack_2e6,b) + (ulong)(uVar23 >> 6) * 8);
      *puVar1 = *puVar1 & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
      uVar23 = uVar23 + 1;
    } while (uVar23 <= uVar27 && uVar27 - uVar23 != 0);
  }
  inDataPtr = local_330;
  pcVar20 = local_330;
  pCVar13 = pCVar22;
  pCVar24 = pCVar12;
  if ((int)minY <= (int)maxY) {
    do {
      pCVar22 = pCVar13;
      if (pCVar12 != pCVar13) {
        uVar23 = 1;
        uVar27 = 0;
        pCVar13 = pCVar24;
        do {
          uVar3 = pCVar22[uVar27].ySampling;
          if ((int)minY < 0) {
            if (-1 < (int)uVar3) {
              uVar7 = (uVar3 + ~minY) / uVar3;
              goto LAB_0017462c;
            }
            uVar7 = (~uVar3 - minY) / -uVar3;
          }
          else if ((int)uVar3 < 0) {
            uVar7 = minY / -uVar3;
LAB_0017462c:
            uVar7 = -uVar7;
          }
          else {
            uVar7 = minY / uVar3;
          }
          if (minY == uVar7 * uVar3) {
            this_00 = (vector<char_const*,std::allocator<char_const*>> *)
                      (rowPtrs.
                       super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar27);
            __position._M_current = *(char ***)(this_00 + 8);
            if (__position._M_current == *(char ***)(this_00 + 0x10)) {
              std::vector<char_const*,std::allocator<char_const*>>::
              _M_realloc_insert<char_const*const&>(this_00,__position,&inDataPtr);
            }
            else {
              *__position._M_current = pcVar20;
              *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
            }
            iVar9 = pCVar22[uVar27].width;
            iVar8 = pixelTypeSize(pCVar22[uVar27].type);
            pcVar20 = inDataPtr + (long)iVar8 * (long)iVar9;
            pCVar22 = (this->_channelData).
                      super__Vector_base<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pCVar13 = (this->_channelData).
                      super__Vector_base<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            inDataPtr = pcVar20;
          }
          uVar27 = (ulong)uVar23;
          uVar25 = ((long)pCVar13 - (long)pCVar22 >> 3) * -0x79435e50d79435e5;
          uVar23 = uVar23 + 1;
          pCVar24 = pCVar13;
        } while (uVar27 <= uVar25 && uVar25 - uVar27 != 0);
      }
      bVar28 = minY != maxY;
      pCVar12 = pCVar13;
      pCVar13 = pCVar22;
      minY = minY + 1;
    } while (bVar28);
  }
  inDataPtr = local_330;
  pCVar14 = (this->_cscSets).
            super__Vector_base<Imf_3_2::DwaCompressor::CscChannelSet,_std::allocator<Imf_3_2::DwaCompressor::CscChannelSet>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_cscSets).
      super__Vector_base<Imf_3_2::DwaCompressor::CscChannelSet,_std::allocator<Imf_3_2::DwaCompressor::CscChannelSet>_>
      ._M_impl.super__Vector_impl_data._M_finish != pCVar14) {
    uVar27 = 0;
    uVar25 = 1;
    do {
      iVar9 = pCVar14[uVar27].idx[0];
      pCVar12 = (this->_channelData).
                super__Vector_base<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
                ._M_impl.super__Vector_impl_data._M_start;
      LossyDctEncoderCsc::LossyDctEncoderCsc
                ((LossyDctEncoderCsc *)&writePtr,this->_dwaCompressionLevel / 100000.0,
                 rowPtrs.
                 super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + iVar9,
                 rowPtrs.
                 super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + pCVar14[uVar27].idx[1],
                 rowPtrs.
                 super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + pCVar14[uVar27].idx[2],local_350,
                 local_358,(unsigned_short *)dwaCompressorToNonlinear,pCVar12[iVar9].width,
                 pCVar12[iVar9].height,pCVar12[iVar9].type,pCVar12[pCVar14[uVar27].idx[1]].type,
                 pCVar12[pCVar14[uVar27].idx[2]].type);
      LossyDctEncoderBase::execute((LossyDctEncoderBase *)&writePtr);
      *(long *)(pcVar11 + 0x40) = *(long *)(pcVar11 + 0x40) + (long)local_290;
      *(long *)(pcVar11 + 0x48) = *(long *)(pcVar11 + 0x48) + (long)local_28c;
      pCVar14 = (this->_cscSets).
                super__Vector_base<Imf_3_2::DwaCompressor::CscChannelSet,_std::allocator<Imf_3_2::DwaCompressor::CscChannelSet>_>
                ._M_impl.super__Vector_impl_data._M_start;
      iVar9 = pCVar14[uVar27].idx[0];
      lVar19 = CONCAT62(uStack_2e6,b);
      iVar8 = iVar9 + 0x3f;
      if (-1 < (long)iVar9) {
        iVar8 = iVar9;
      }
      puVar1 = (ulong *)(lVar19 + (long)(iVar8 >> 6) * 8 + -8 +
                        (ulong)(((long)iVar9 & 0x800000000000003fU) < 0x8000000000000001) * 8);
      *puVar1 = *puVar1 | 1L << ((byte)iVar9 & 0x3f);
      iVar9 = pCVar14[uVar27].idx[1];
      iVar8 = iVar9 + 0x3f;
      if (-1 < (long)iVar9) {
        iVar8 = iVar9;
      }
      puVar1 = (ulong *)(lVar19 + (long)(iVar8 >> 6) * 8 + -8 +
                        (ulong)(((long)iVar9 & 0x800000000000003fU) < 0x8000000000000001) * 8);
      *puVar1 = *puVar1 | 1L << ((byte)iVar9 & 0x3f);
      local_350 = local_350 + (long)local_290 * 2;
      local_358 = local_358 + (long)local_28c * 2;
      iVar9 = pCVar14[uVar27].idx[2];
      iVar8 = iVar9 + 0x3f;
      if (-1 < (long)iVar9) {
        iVar8 = iVar9;
      }
      puVar1 = (ulong *)(lVar19 + (long)(iVar8 >> 6) * 8 + -8 +
                        (ulong)(((long)iVar9 & 0x800000000000003fU) < 0x8000000000000001) * 8);
      *puVar1 = *puVar1 | 1L << ((byte)iVar9 & 0x3f);
      LossyDctEncoderBase::~LossyDctEncoderBase((LossyDctEncoderBase *)&writePtr);
      pCVar14 = (this->_cscSets).
                super__Vector_base<Imf_3_2::DwaCompressor::CscChannelSet,_std::allocator<Imf_3_2::DwaCompressor::CscChannelSet>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar27 = ((long)(this->_cscSets).
                      super__Vector_base<Imf_3_2::DwaCompressor::CscChannelSet,_std::allocator<Imf_3_2::DwaCompressor::CscChannelSet>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar14 >> 2) *
               -0x5555555555555555;
      bVar28 = uVar25 <= uVar27;
      lVar19 = uVar27 - uVar25;
      uVar27 = uVar25;
      uVar25 = (ulong)((int)uVar25 + 1);
    } while (bVar28 && lVar19 != 0);
    pCVar22 = (this->_channelData).
              super__Vector_base<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pCVar24 = (this->_channelData).
              super__Vector_base<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  if (pCVar24 != pCVar22) {
    lVar19 = CONCAT62(uStack_2e6,b);
    uVar27 = 0;
    do {
      if ((*(ulong *)(lVar19 + (uVar27 >> 6) * 8) >> (uVar27 & 0x3f) & 1) == 0) {
        CVar4 = pCVar22[uVar27].compression;
        if (CVar4 == UNKNOWN) {
          iVar9 = pCVar22[uVar27].width;
          iVar8 = pixelTypeSize(pCVar22[uVar27].type);
          ppcVar15 = rowPtrs.
                     super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar27].
                     super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          if (rowPtrs.
              super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar27].
              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_finish != ppcVar15) {
            __n = (long)iVar8 * (long)iVar9;
            pcVar20 = pCVar22[uVar27].planarUncBufferEnd;
            uVar25 = 0;
            uVar26 = 1;
            do {
              memcpy(pcVar20,ppcVar15[uVar25],__n);
              pcVar20 = pCVar22[uVar27].planarUncBufferEnd + __n;
              pCVar22[uVar27].planarUncBufferEnd = pcVar20;
              ppcVar15 = rowPtrs.
                         super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar27].
                         super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                         super__Vector_impl_data._M_start;
              bVar28 = uVar26 < (ulong)((long)rowPtrs.
                                              super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start[uVar27].
                                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)ppcVar15 >> 3);
              uVar25 = uVar26;
              uVar26 = (ulong)((int)uVar26 + 1);
            } while (bVar28);
          }
          *(long *)(pcVar11 + 8) = *(long *)(pcVar11 + 8) + (long)pCVar22[uVar27].planarUncSize;
        }
        else if (CVar4 == LOSSY_DCT) {
          toNonlinear = dwaCompressorToNonlinear;
          if (pCVar22[uVar27].pLinear != false) {
            toNonlinear = (undefined1 *)0x0;
          }
          LossyDctEncoder::LossyDctEncoder
                    ((LossyDctEncoder *)&writePtr,this->_dwaCompressionLevel / 100000.0,
                     rowPtrs.
                     super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar27,local_350,local_358,
                     (unsigned_short *)toNonlinear,pCVar22[uVar27].width,pCVar22[uVar27].height,
                     pCVar22[uVar27].type);
          LossyDctEncoderBase::execute((LossyDctEncoderBase *)&writePtr);
          *(long *)(pcVar11 + 0x40) = *(long *)(pcVar11 + 0x40) + (long)local_290;
          *(long *)(pcVar11 + 0x48) = *(long *)(pcVar11 + 0x48) + (long)local_28c;
          local_350 = local_350 + (long)local_290 * 2;
          local_358 = local_358 + (long)local_28c * 2;
          LossyDctEncoderBase::~LossyDctEncoderBase((LossyDctEncoderBase *)&writePtr);
        }
        else if (CVar4 == RLE) {
          local_330 = (char *)(uVar27 * 3);
          ppcVar15 = rowPtrs.
                     super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar27].
                     super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          if (rowPtrs.
              super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar27].
              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_finish != ppcVar15) {
            local_368 = 0;
            do {
              iVar9 = pCVar22[uVar27].width;
              if (0 < iVar9) {
                pcVar20 = ppcVar15[local_368];
                iVar8 = 0;
                do {
                  for (lVar19 = 0; iVar9 = pixelTypeSize(pCVar22[uVar27].type), lVar19 < iVar9;
                      lVar19 = lVar19 + 1) {
                    cVar2 = pcVar20[lVar19];
                    pcVar17 = pCVar22[uVar27].planarUncRleEnd[lVar19];
                    pCVar22[uVar27].planarUncRleEnd[lVar19] = pcVar17 + 1;
                    *pcVar17 = cVar2;
                  }
                  iVar8 = iVar8 + 1;
                  iVar9 = pCVar22[uVar27].width;
                  pcVar20 = pcVar20 + lVar19;
                } while (iVar8 < iVar9);
              }
              iVar8 = pixelTypeSize(pCVar22[uVar27].type);
              *(long *)(pcVar11 + 0x38) = *(long *)(pcVar11 + 0x38) + (long)(iVar8 * iVar9);
              local_368 = (ulong)((int)local_368 + 1);
              ppcVar15 = (&((rowPtrs.
                             super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
                           super__Vector_impl_data._M_start)[(long)local_330];
            } while (local_368 <
                     (ulong)((long)(&((rowPtrs.
                                       super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                     )._M_impl.super__Vector_impl_data._M_finish)[(long)local_330] -
                             (long)ppcVar15 >> 3));
          }
        }
        lVar19 = CONCAT62(uStack_2e6,b);
        puVar1 = (ulong *)(lVar19 + (uVar27 >> 6) * 8);
        *puVar1 = *puVar1 | 1L << ((byte)uVar27 & 0x3f);
        pCVar22 = (this->_channelData).
                  super__Vector_base<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pCVar24 = (this->_channelData).
                  super__Vector_base<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar27 = (ulong)((int)uVar27 + 1);
      uVar25 = ((long)pCVar24 - (long)pCVar22 >> 3) * -0x79435e50d79435e5;
    } while (uVar27 <= uVar25 && uVar25 - uVar27 != 0);
  }
  lVar19 = *(long *)(pcVar11 + 8);
  pcVar20 = local_328;
  if (lVar19 != 0) {
    pcVar20 = this->_planarUncBuffer[0];
    uVar16 = exr_compress_max_buffer_size(lVar19);
    iVar9 = exr_compress_buffer(9,pcVar20,lVar19,local_328,uVar16,&writePtr);
    if (iVar9 != 0) {
      pBVar18 = (BaseExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::BaseExc::BaseExc(pBVar18,"Data compression (zlib) failed.");
      __cxa_throw(pBVar18,&Iex_3_2::BaseExc::typeinfo,Iex_3_2::BaseExc::~BaseExc);
    }
    *(char **)(pcVar11 + 0x10) = writePtr;
    pcVar20 = local_328 + (long)writePtr;
  }
  lVar19 = *(long *)(pcVar11 + 0x40);
  if (lVar19 != 0) {
    if (this->_acCompression == STATIC_HUFFMAN) {
      iVar9 = hufCompress((unsigned_short *)this->_packedAcBuffer,(int)lVar19,pcVar20);
      pcVar17 = (char *)(long)iVar9;
      *(char **)(pcVar11 + 0x18) = pcVar17;
    }
    else if (this->_acCompression == DEFLATE) {
      pcVar17 = this->_packedAcBuffer;
      uVar16 = exr_compress_max_buffer_size(lVar19 * 2);
      iVar9 = exr_compress_buffer(9,pcVar17,lVar19 * 2,pcVar20,uVar16,&writePtr);
      if (iVar9 != 0) {
        this_01 = (InputExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::InputExc::InputExc(this_01,"Data compression (zlib) failed.");
        __cxa_throw(this_01,&Iex_3_2::InputExc::typeinfo,Iex_3_2::InputExc::~InputExc);
      }
      *(char **)(pcVar11 + 0x18) = writePtr;
      pcVar17 = writePtr;
    }
    else {
      pcVar17 = *(char **)(pcVar11 + 0x18);
    }
    pcVar20 = pcVar20 + (long)pcVar17;
  }
  if (*(long *)(pcVar11 + 0x48) != 0) {
    iVar9 = Zip::compress(this->_zip,this->_packedDcBuffer,(int)*(long *)(pcVar11 + 0x48) * 2,
                          pcVar20);
    *(long *)(pcVar11 + 0x20) = (long)iVar9;
    pcVar20 = pcVar20 + iVar9;
  }
  if (*(long *)(pcVar11 + 0x38) != 0) {
    iVar9 = rleCompress((int)*(long *)(pcVar11 + 0x38),this->_planarUncBuffer[2],this->_rleBuffer);
    lVar19 = (long)iVar9;
    *(long *)(pcVar11 + 0x30) = lVar19;
    pcVar17 = this->_rleBuffer;
    uVar16 = exr_compress_max_buffer_size(lVar19);
    iVar9 = exr_compress_buffer(9,pcVar17,lVar19,pcVar20,uVar16,&writePtr);
    if (iVar9 != 0) {
      pBVar18 = (BaseExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::BaseExc::BaseExc(pBVar18,"Error compressing RLE\'d data.");
      __cxa_throw(pBVar18,&Iex_3_2::BaseExc::typeinfo,Iex_3_2::BaseExc::~BaseExc);
    }
    *(char **)(pcVar11 + 0x28) = writePtr;
    pcVar20 = pcVar20 + (long)writePtr;
  }
  lVar19 = 0;
  do {
    writePtr = this->_outBuffer + lVar19;
    Xdr::write<Imf_3_2::CharPtrIO,char*>(&writePtr,*(uint64_t *)(this->_outBuffer + lVar19));
    lVar19 = lVar19 + 8;
  } while (lVar19 != 0x58);
  pcVar11 = this->_outBuffer;
  *outPtr = pcVar11;
  std::
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ::~vector(&rowPtrs);
  pvVar6 = (void *)CONCAT62(uStack_2e6,b);
  if (pvVar6 != (void *)0x0) {
    operator_delete(pvVar6,(long)local_2c8 - (long)pvVar6);
  }
  std::
  vector<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>::
  ~vector(&channelRules);
  return (int)pcVar20 - (int)pcVar11;
}

Assistant:

int
DwaCompressor::compress (
    const char*            inPtr,
    int                    inSize,
    IMATH_NAMESPACE::Box2i range,
    const char*&           outPtr)
{
    const char* inDataPtr   = inPtr;
    char*       packedAcEnd = 0;
    char*       packedDcEnd = 0;
    int         fileVersion = 2; // Starting with 2, we write the channel
                                 // classification rules into the file

    if (fileVersion < 2)
        initializeLegacyChannelRules ();
    else
        initializeDefaultChannelRules ();

    size_t outBufferSize = 0;
    initializeBuffers (outBufferSize);

    unsigned short          channelRuleSize = 0;
    std::vector<Classifier> channelRules;
    if (fileVersion >= 2)
    {
        relevantChannelRules (channelRules);

        channelRuleSize = Xdr::size<unsigned short> ();
        for (size_t i = 0; i < channelRules.size (); ++i)
            channelRuleSize += channelRules[i].size ();
    }

    //
    // Remember to allocate _outBuffer, if we haven't done so already.
    //

    outBufferSize += channelRuleSize;
    if (outBufferSize > _outBufferSize)
    {
        _outBufferSize = outBufferSize;
        if (_outBuffer != 0) delete[] _outBuffer;
        _outBuffer = new char[outBufferSize];
    }

    char* outDataPtr =
        &_outBuffer[NUM_SIZES_SINGLE * sizeof (uint64_t) + channelRuleSize];

    //
    // We might not be dealing with any color data, in which
    // case the AC buffer size will be 0, and dereferencing
    // a vector will not be a good thing to do.
    //

    if (_packedAcBuffer) packedAcEnd = _packedAcBuffer;

    if (_packedDcBuffer) packedDcEnd = _packedDcBuffer;

#define OBIDX(x) (uint64_t*) &_outBuffer[x * sizeof (uint64_t)]

    uint64_t* version                 = OBIDX (VERSION);
    uint64_t* unknownUncompressedSize = OBIDX (UNKNOWN_UNCOMPRESSED_SIZE);
    uint64_t* unknownCompressedSize   = OBIDX (UNKNOWN_COMPRESSED_SIZE);
    uint64_t* acCompressedSize        = OBIDX (AC_COMPRESSED_SIZE);
    uint64_t* dcCompressedSize        = OBIDX (DC_COMPRESSED_SIZE);
    uint64_t* rleCompressedSize       = OBIDX (RLE_COMPRESSED_SIZE);
    uint64_t* rleUncompressedSize     = OBIDX (RLE_UNCOMPRESSED_SIZE);
    uint64_t* rleRawSize              = OBIDX (RLE_RAW_SIZE);

    uint64_t* totalAcUncompressedCount = OBIDX (AC_UNCOMPRESSED_COUNT);
    uint64_t* totalDcUncompressedCount = OBIDX (DC_UNCOMPRESSED_COUNT);

    uint64_t* acCompression = OBIDX (AC_COMPRESSION);

    int minX = range.min.x;
    int maxX = std::min (range.max.x, _max[0]);
    int minY = range.min.y;
    int maxY = std::min (range.max.y, _max[1]);

    //
    // Zero all the numbers in the chunk header
    //

    memset (_outBuffer, 0, NUM_SIZES_SINGLE * sizeof (uint64_t));

    //
    // Setup the AC compression strategy and the version in the data block,
    // then write the relevant channel classification rules if needed
    //
    *version       = fileVersion;
    *acCompression = _acCompression;

    setupChannelData (minX, minY, maxX, maxY);

    if (fileVersion >= 2)
    {
        char* writePtr = &_outBuffer[NUM_SIZES_SINGLE * sizeof (uint64_t)];
        Xdr::write<CharPtrIO> (writePtr, channelRuleSize);

        for (size_t i = 0; i < channelRules.size (); ++i)
            channelRules[i].write (writePtr);
    }

    //
    // Determine the start of each row in the input buffer
    // Channels are interleaved by scanline
    //

    std::vector<bool> encodedChannels (_channelData.size ());
    std::vector<std::vector<const char*>> rowPtrs (_channelData.size ());

    for (unsigned int chan = 0; chan < _channelData.size (); ++chan)
        encodedChannels[chan] = false;

    inDataPtr = inPtr;

    for (int y = minY; y <= maxY; ++y)
    {
        for (unsigned int chan = 0; chan < _channelData.size (); ++chan)
        {

            ChannelData* cd = &_channelData[chan];

            if (IMATH_NAMESPACE::modp (y, cd->ySampling) != 0) continue;

            rowPtrs[chan].push_back (inDataPtr);
            inDataPtr +=
                cd->width * OPENEXR_IMF_NAMESPACE::pixelTypeSize (cd->type);
        }
    }

    inDataPtr = inPtr;

    //
    // Make a pass over all our CSC sets and try to encode them first
    //

    for (unsigned int csc = 0; csc < _cscSets.size (); ++csc)
    {

        LossyDctEncoderCsc encoder (
            _dwaCompressionLevel / 100000.f,
            rowPtrs[_cscSets[csc].idx[0]],
            rowPtrs[_cscSets[csc].idx[1]],
            rowPtrs[_cscSets[csc].idx[2]],
            packedAcEnd,
            packedDcEnd,
            dwaCompressorToNonlinear,
            _channelData[_cscSets[csc].idx[0]].width,
            _channelData[_cscSets[csc].idx[0]].height,
            _channelData[_cscSets[csc].idx[0]].type,
            _channelData[_cscSets[csc].idx[1]].type,
            _channelData[_cscSets[csc].idx[2]].type);

        encoder.execute ();

        *totalAcUncompressedCount += encoder.numAcValuesEncoded ();
        *totalDcUncompressedCount += encoder.numDcValuesEncoded ();

        packedAcEnd += encoder.numAcValuesEncoded () * sizeof (unsigned short);
        packedDcEnd += encoder.numDcValuesEncoded () * sizeof (unsigned short);

        encodedChannels[_cscSets[csc].idx[0]] = true;
        encodedChannels[_cscSets[csc].idx[1]] = true;
        encodedChannels[_cscSets[csc].idx[2]] = true;
    }

    for (unsigned int chan = 0; chan < _channelData.size (); ++chan)
    {
        ChannelData* cd = &_channelData[chan];

        if (encodedChannels[chan]) continue;

        switch (cd->compression)
        {
            case LOSSY_DCT:

                //
                // For LOSSY_DCT, treat this just like the CSC'd case,
                // but only operate on one channel
                //

                {
                    const unsigned short* nonlinearLut = 0;

                    if (!cd->pLinear) nonlinearLut = dwaCompressorToNonlinear;

                    LossyDctEncoder encoder (
                        _dwaCompressionLevel / 100000.f,
                        rowPtrs[chan],
                        packedAcEnd,
                        packedDcEnd,
                        nonlinearLut,
                        cd->width,
                        cd->height,
                        cd->type);

                    encoder.execute ();

                    *totalAcUncompressedCount += encoder.numAcValuesEncoded ();
                    *totalDcUncompressedCount += encoder.numDcValuesEncoded ();

                    packedAcEnd +=
                        encoder.numAcValuesEncoded () * sizeof (unsigned short);

                    packedDcEnd +=
                        encoder.numDcValuesEncoded () * sizeof (unsigned short);
                }

                break;

            case RLE:

                //
                // For RLE, bash the bytes up so that the first bytes of each
                // pixel are contiguous, as are the second bytes, and so on.
                //

                for (unsigned int y = 0; y < rowPtrs[chan].size (); ++y)
                {
                    const char* row = rowPtrs[chan][y];

                    for (int x = 0; x < cd->width; ++x)
                    {
                        for (int byte = 0;
                             byte <
                             OPENEXR_IMF_NAMESPACE::pixelTypeSize (cd->type);
                             ++byte)
                        {

                            *cd->planarUncRleEnd[byte]++ = *row++;
                        }
                    }

                    *rleRawSize +=
                        cd->width *
                        OPENEXR_IMF_NAMESPACE::pixelTypeSize (cd->type);
                }

                break;

            case UNKNOWN:

                //
                // Otherwise, just copy data over verbatim
                //

                {
                    int scanlineSize =
                        cd->width *
                        OPENEXR_IMF_NAMESPACE::pixelTypeSize (cd->type);

                    for (unsigned int y = 0; y < rowPtrs[chan].size (); ++y)
                    {
                        memcpy (
                            cd->planarUncBufferEnd,
                            rowPtrs[chan][y],
                            scanlineSize);

                        cd->planarUncBufferEnd += scanlineSize;
                    }

                    *unknownUncompressedSize += cd->planarUncSize;
                }

                break;

            default: assert (false);
        }

        encodedChannels[chan] = true;
    }

    //
    // Pack the Unknown data into the output buffer first. Instead of
    // just copying it uncompressed, try zlib compression at least.
    //

    if (*unknownUncompressedSize > 0)
    {
        size_t outSize;
        if (EXR_ERR_SUCCESS != exr_compress_buffer(
                9, // TODO: use default??? the old call to zlib had 9 hardcoded
                _planarUncBuffer[UNKNOWN],
                *unknownUncompressedSize,
                outDataPtr,
                exr_compress_max_buffer_size (*unknownUncompressedSize),
                &outSize))
        {
            throw IEX_NAMESPACE::BaseExc ("Data compression (zlib) failed.");
        }

        outDataPtr += outSize;
        *unknownCompressedSize = outSize;
    }

    //
    // Now, pack all the Lossy DCT coefficients into our output
    // buffer, with Huffman encoding.
    //
    // Also, record the compressed size and the number of
    // uncompressed componentns we have.
    //

    if (*totalAcUncompressedCount > 0)
    {
        switch (_acCompression)
        {
            case STATIC_HUFFMAN:

                *acCompressedSize = (int) hufCompress (
                    (unsigned short*) _packedAcBuffer,
                    (int) *totalAcUncompressedCount,
                    outDataPtr);
                break;

            case DEFLATE:

            {
                size_t sourceLen = *totalAcUncompressedCount * sizeof (unsigned short);
                size_t destLen;
                if (EXR_ERR_SUCCESS != exr_compress_buffer(
                        9, // TODO: use default??? the old call to zlib had 9 hardcoded
                        _packedAcBuffer,
                        sourceLen,
                        outDataPtr,
                        exr_compress_max_buffer_size (sourceLen),
                        &destLen))
                {
                    throw IEX_NAMESPACE::InputExc (
                        "Data compression (zlib) failed.");
                }

                *acCompressedSize = destLen;
            }

            break;

            default: assert (false);
        }

        outDataPtr += *acCompressedSize;
    }

    //
    // Handle the DC components separately
    //

    if (*totalDcUncompressedCount > 0)
    {
        *dcCompressedSize = _zip->compress (
            _packedDcBuffer,
            (int) (*totalDcUncompressedCount) * sizeof (unsigned short),
            outDataPtr);

        outDataPtr += *dcCompressedSize;
    }

    //
    // If we have RLE data, first RLE encode it and set the uncompressed
    // size. Then, deflate the results and set the compressed size.
    //

    if (*rleRawSize > 0)
    {
        *rleUncompressedSize = rleCompress (
            (int) (*rleRawSize),
            _planarUncBuffer[RLE],
            (signed char*) _rleBuffer);

        size_t dstLen;
        if (EXR_ERR_SUCCESS != exr_compress_buffer(
                9, // TODO: use default??? the old call to zlib had 9 hardcoded
                _rleBuffer,
                *rleUncompressedSize,
                outDataPtr,
                exr_compress_max_buffer_size (*rleUncompressedSize),
                &dstLen))
        {
            throw IEX_NAMESPACE::BaseExc ("Error compressing RLE'd data.");
        }

        *rleCompressedSize = dstLen;
        outDataPtr += *rleCompressedSize;
    }

    //
    // Flip the counters to XDR format
    //

    for (int i = 0; i < NUM_SIZES_SINGLE; ++i)
    {
        uint64_t src = *(((uint64_t*) _outBuffer) + i);
        char*    dst = (char*) (((uint64_t*) _outBuffer) + i);

        Xdr::write<CharPtrIO> (dst, src);
    }

    //
    // We're done - compute the number of bytes we packed
    //

    outPtr = _outBuffer;

    return static_cast<int> (outDataPtr - _outBuffer);
}